

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcSlab::~IfcSlab(IfcSlab *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x2a];
  *(void **)&this->field_0x88 = vtt[0x2b];
  *(void **)&this->field_0x98 = vtt[0x2c];
  *(void **)&this->field_0xd0 = vtt[0x2d];
  *(void **)&this->field_0x100 = vtt[0x2e];
  *(void **)&this->field_0x138 = vtt[0x2f];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0x30];
  std::__cxx11::string::~string
            ((string *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x10
            );
  IfcElement::~IfcElement((IfcElement *)this,vtt + 2);
  return;
}

Assistant:

IfcSlab() : Object("IfcSlab") {}